

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CordOutputStream::CordOutputStream
          (CordOutputStream *this,Cord *cord,CordBuffer *buffer,size_t size_hint)

{
  CordRep *pCVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CordOutputStream_0053f808;
  pCVar1 = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.cordz_info =
       (cord->contents_).data_.rep_.field_0.as_tree.cordz_info;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.rep = pCVar1;
  (cord->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (cord->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  this->size_hint_ = size_hint;
  sVar3 = absl::lts_20250127::CordBuffer::length(buffer);
  sVar4 = absl::lts_20250127::CordBuffer::capacity(buffer);
  this->state_ = (sVar3 < sVar4) + kFull;
  pvVar2 = (buffer->rep_).field_0.long_rep.padding;
  (this->buffer_).rep_.field_0.long_rep.rep = (buffer->rep_).field_0.long_rep.rep;
  (this->buffer_).rep_.field_0.long_rep.padding = pvVar2;
  (buffer->rep_).field_0.short_rep.raw_size = '\x01';
  return;
}

Assistant:

CordOutputStream::CordOutputStream(absl::Cord cord, absl::CordBuffer buffer,
                                   size_t size_hint)
    : cord_(std::move(cord)),
      size_hint_(size_hint),
      state_(buffer.length() < buffer.capacity() ? State::kPartial
                                                 : State::kFull),
      buffer_(std::move(buffer)) {}